

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O2

bool __thiscall Clasp::Asp::Preprocessor::classifyProgram(Preprocessor *this,VarVec *supported)

{
  uint uVar1;
  PrgNode PVar2;
  bool bVar3;
  uint32 bodyId_00;
  ulong in_RAX;
  PrgBody *pPVar4;
  byte bVar5;
  ulong uVar6;
  size_type index;
  Var bodyId;
  
  _index = in_RAX & 0xffffffff00000000;
  (this->follow_).ebo_.size = 0;
  bVar3 = LogicProgram::propagate(this->prg_,true);
  if (bVar3) {
    uVar6 = 0;
    do {
      while( true ) {
        bodyId_00 = nextBodyId(this,&index);
        _index = CONCAT44(bodyId_00,index);
        if (bodyId_00 == 0x40000000) break;
        pPVar4 = addBodyVar(this,bodyId_00);
        bVar3 = LogicProgram::hasConflict(this->prg_);
        if ((bVar3) || (bVar3 = addHeadsToUpper(this,pPVar4), !bVar3)) goto LAB_00178264;
      }
      (this->follow_).ebo_.size = 0;
      _index = 0x4000000000000000;
      for (uVar6 = uVar6 & 0xffffffff; uVar6 < (supported->ebo_).size; uVar6 = uVar6 + 1) {
        uVar1 = (supported->ebo_).buf[uVar6];
        _index = (ulong)uVar1 << 0x20;
        pPVar4 = (this->prg_->bodies_).ebo_.buf[uVar1];
        PVar2 = pPVar4->super_PrgNode;
        if ((int)(this->bodyInfo_).ebo_.buf[uVar1] < 0) {
          bVar5 = PVar2._7_1_ >> 6 & 1;
        }
        else {
          bVar5 = 1;
          if (((ulong)PVar2 >> 0x3e & 1) == 0) {
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&this->follow_,&bodyId);
            break;
          }
        }
        if (bVar5 == 1 && (PVar2._0_4_ & 0x7fffffff) != 1) {
          pPVar4->super_PrgNode = (PrgNode)(((ulong)PVar2 & 0xffffffff80000000) + 1);
        }
      }
    } while ((this->follow_).ebo_.size != 0);
    bVar3 = LogicProgram::hasConflict(this->prg_);
    bVar3 = !bVar3;
  }
  else {
LAB_00178264:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Preprocessor::classifyProgram(const VarVec& supported) {
	Var bodyId; PrgBody* body;
	VarVec::size_type index = 0;
	follow_.clear();
	if (!prg_->propagate(true)) { return false; }
	for (VarVec::size_type i = 0;;) {
		while ( (bodyId = nextBodyId(index)) != varMax ) {
			body = addBodyVar(bodyId);
			if (prg_->hasConflict())    { return false; }
			if (!addHeadsToUpper(body)) { return false; }
		}
		follow_.clear();
		index = 0;
		// select next unclassified supported body
		for (; i < supported.size(); ++i) {
			bodyId  = supported[i];
			body    = prg_->getBody(bodyId);
			if (bodyInfo_[bodyId].bSeen == 0 && body->relevant()) {
				follow_.push_back(bodyId);
				break;
			}
			else if (!body->relevant() && body->hasVar()) {
				body->clearLiteral(false);
			}
		}
		if (follow_.empty()) break;
	}
	return !prg_->hasConflict();
}